

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

void __thiscall
duckdb::QuantileCursor<duckdb::date_t>::QuantileCursor
          (QuantileCursor<duckdb::date_t> *this,WindowPartitionInput *partition)

{
  ColumnDataCollection *this_00;
  byte *pbVar1;
  InternalException *this_01;
  vector<unsigned_long,_true> local_68;
  string local_50;
  
  this->inputs = partition->inputs;
  (this->scan).current_chunk_state.handles._M_h._M_buckets =
       &(this->scan).current_chunk_state.handles._M_h._M_single_bucket;
  (this->scan).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->scan).current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->scan).current_chunk_state.handles._M_h._M_element_count = 0;
  (this->scan).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->scan).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  (this->scan).current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->scan).current_chunk_state.properties = INVALID;
  (this->scan).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->scan).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->scan).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DataChunk::DataChunk(&this->page);
  this->data = (date_t *)0x0;
  this->validity = (ValidityMask *)0x0;
  this_00 = this->inputs;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
             &(partition->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnDataCollection::InitializeScan(this_00,&this->scan,&local_68,ALLOW_ZERO_COPY);
  if (local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ColumnDataCollection::InitializeScanChunk(this->inputs,&this->scan,&this->page);
  pbVar1 = (byte *)(partition->all_valid).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base._M_p;
  if (((long)(partition->all_valid).super_vector<bool,_std::allocator<bool>_>.
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_p - (long)pbVar1) * 8 +
      (ulong)*(uint *)((long)&(partition->all_valid).super_vector<bool,_std::allocator<bool>_>.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) != 0)
  {
    this->all_valid = (bool)(*pbVar1 & 1);
    return;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Attempted to access index %ld within vector of size %ld","");
  InternalException::InternalException<unsigned_long,unsigned_long>(this_01,&local_50,0,0);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

explicit QuantileCursor(const WindowPartitionInput &partition) : inputs(*partition.inputs) {
		D_ASSERT(partition.column_ids.size() == 1);
		inputs.InitializeScan(scan, partition.column_ids);
		inputs.InitializeScanChunk(scan, page);

		D_ASSERT(partition.all_valid.size() == 1);
		all_valid = partition.all_valid[0];
	}